

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool gompertz_check(double a,double b)

{
  double b_local;
  double a_local;
  
  if (1.0 < a) {
    if (0.0 < b) {
      a_local._7_1_ = true;
    }
    else {
      std::operator<<((ostream *)&std::cout," \n");
      std::operator<<((ostream *)&std::cout,"GOMPERTZ_CHECK - Warning!\n");
      std::operator<<((ostream *)&std::cout,"  B <= 0.0!\n");
      a_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"GOMPERTZ_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  A <= 1.0!\n");
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool gompertz_check ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    GOMPERTZ_CHECK checks the parameters of the Gompertz PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Johnson, Kotz, and Balakrishnan,
//    Continuous Univariate Distributions, Volume 2, second edition,
//    Wiley, 1994, pages 25-26.
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    1 < A, 0 < B.
//
//    Output, bool GOMPERTZ_CHECK, is true if the parameters are legal.
//
{
  if ( a <= 1.0 )
  {
    cout << " \n";
    cout << "GOMPERTZ_CHECK - Warning!\n";
    cout << "  A <= 1.0!\n";
    return false;
  }

  if ( b <= 0.0 )
  {
    cout << " \n";
    cout << "GOMPERTZ_CHECK - Warning!\n";
    cout << "  B <= 0.0!\n";
    return false;
  }

  return true;
}